

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> uVar1;
  TokenType TVar2;
  TokenType TVar3;
  Result RVar4;
  long lVar5;
  Enum EVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_b8 [32];
  undefined1 *local_98 [2];
  undefined1 local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined8 uStack_50;
  _Head_base<0UL,_wabt::ModuleCommand_*,_false> local_40;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  
  command._M_t.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
  ._M_t.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
  super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>)
       operator_new(0x50);
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   command._M_t.
   super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
   super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
   super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 **)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x18) =
       (undefined8 *)
       ((long)command._M_t.
              super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
              .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x48);
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x20) = 1;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)command._M_t.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x38) = 0x3f800000;
  TVar2 = Peek(this,0);
  TVar3 = Peek(this,1);
  if (((TVar2 == Lpar) && (TVar3 < First_Literal)) &&
     ((0x2c008dd800U >> ((ulong)TVar3 & 0x3f) & 1) != 0)) {
    MakeUnique<wabt::ModuleCommand>();
    GetToken((Token *)local_b8,this);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
    uStack_50 = local_b8._24_8_;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
    Token::~Token((Token *)local_b8);
    ((local_40._M_head_impl)->module).loc.field_1.field_1.offset =
         (size_t)local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&((local_40._M_head_impl)->module).loc.field_1 + 8) = uStack_50;
    ((local_40._M_head_impl)->module).loc.filename.data_ =
         (char *)local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    ((local_40._M_head_impl)->module).loc.filename.size_ =
         (size_type)
         local_68.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    RVar4 = ParseModuleFieldList(this,&(local_40._M_head_impl)->module);
    if (RVar4.enum_ != Error) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)command._M_t.
                    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                    .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &local_40);
    }
    if (local_40._M_head_impl != (ModuleCommand *)0x0) {
      (*((local_40._M_head_impl)->super_CommandMixin<(wabt::CommandType)0>).super_Command.
        _vptr_Command[1])();
    }
joined_r0x00f6f0ed:
    EVar6 = Error;
    if (RVar4.enum_ == Error) goto LAB_00f6f1e5;
  }
  else {
    TVar2 = Peek(this,0);
    TVar3 = Peek(this,1);
    if (((TVar2 == Lpar) && (TVar3 < Result)) && ((0x411203fcU >> (TVar3 & Result) & 1) != 0)) {
      RVar4 = ParseCommandList(this,(Script *)
                                    command._M_t.
                                    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                                    .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>.
                                    _M_head_impl,
                               (CommandPtrVector *)
                               command._M_t.
                               super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                               .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
      goto joined_r0x00f6f0ed;
    }
    Match(this,Lpar);
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a module field","");
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"a command","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,__l,(allocator_type *)&local_40);
    ErrorExpected(this,&local_68,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    lVar5 = 0;
    do {
      if (local_88 + lVar5 != *(undefined1 **)((long)local_98 + lVar5)) {
        operator_delete(*(undefined1 **)((long)local_98 + lVar5));
      }
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x40);
  }
  RVar4 = Expect(this,Eof);
  uVar1 = command;
  EVar6 = Error;
  if ((RVar4.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    command._M_t.
    super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
    super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
         )(__uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>)0x0;
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               (pointer)uVar1._M_t.
                        super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                        .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
    EVar6 = Ok;
  }
LAB_00f6f1e5:
  uVar1._M_t.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
  super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl =
       command._M_t.
       super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
       super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>)
      command._M_t.
      super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
      super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                   *)((long)command._M_t.
                            super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl + 0x18
                     ));
    std::
    vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
    ::~vector((vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               *)uVar1._M_t.
                 super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                 .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
    operator_delete((void *)uVar1._M_t.
                            super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>
                            .super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = MakeUnique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = MakeUnique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}